

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_monster_blow(parser *p)

{
  long *plVar1;
  _Bool _Var2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  blow_effect *pbVar6;
  parser_error pVar7;
  blow_method *pbVar8;
  long *plVar9;
  random_conflict rVar10;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar7 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plVar1 = *(long **)((long)pvVar4 + 0x78);
    if (*(long **)((long)pvVar4 + 0x78) == (long *)0x0) {
      plVar9 = (long *)((long)pvVar4 + 0x78);
    }
    else {
      do {
        plVar9 = plVar1;
        plVar1 = (long *)*plVar9;
      } while ((long *)*plVar9 != (long *)0x0);
    }
    pvVar4 = mem_zalloc(0x30);
    *plVar9 = (long)pvVar4;
    pcVar5 = parser_getsym(p,"method");
    pbVar8 = blow_methods + 1;
    do {
      iVar3 = strcmp(pbVar8->name,pcVar5);
      if (iVar3 == 0) break;
      pbVar8 = pbVar8->next;
    } while (pbVar8 != (blow_method *)0x0);
    *(blow_method **)((long)pvVar4 + 8) = pbVar8;
    if (pbVar8 == (blow_method *)0x0) {
      pVar7 = PARSE_ERROR_UNRECOGNISED_BLOW;
    }
    else {
      _Var2 = parser_hasval(p,"effect");
      if (_Var2) {
        pcVar5 = parser_getsym(p,"effect");
        pbVar6 = findeff(pcVar5);
        *(blow_effect **)((long)pvVar4 + 0x10) = pbVar6;
        if (pbVar6 == (blow_effect *)0x0) {
          return PARSE_ERROR_INVALID_EFFECT;
        }
      }
      else {
        pbVar6 = findeff("NONE");
        *(blow_effect **)((long)pvVar4 + 0x10) = pbVar6;
      }
      _Var2 = parser_hasval(p,"damage");
      pVar7 = PARSE_ERROR_NONE;
      if (_Var2) {
        rVar10 = parser_getrand(p,"damage");
        *(random_conflict *)((long)pvVar4 + 0x18) = rVar10;
        pVar7 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar7;
}

Assistant:

static enum parser_error parse_monster_blow(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_blow *b = r->blow;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	/* Go to the last valid blow, then allocate a new one */
	if (!b) {
		r->blow = mem_zalloc(sizeof(struct monster_blow));
		b = r->blow;
	} else {
		while (b->next)
			b = b->next;
		b->next = mem_zalloc(sizeof(struct monster_blow));
		b = b->next;
	}

	/* Now read the data */
	b->method = findmeth(parser_getsym(p, "method"));
	if (!b->method)
		return PARSE_ERROR_UNRECOGNISED_BLOW;
	if (parser_hasval(p, "effect")) {
		b->effect = findeff(parser_getsym(p, "effect"));
		if (!b->effect)
			return PARSE_ERROR_INVALID_EFFECT;
	} else {
		b->effect = findeff("NONE");
	}
	if (parser_hasval(p, "damage"))
		b->dice = parser_getrand(p, "damage");

	return PARSE_ERROR_NONE;
}